

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

SoundFont * __thiscall sf2cute::SoundFont::operator=(SoundFont *this,SoundFont *origin)

{
  std::
  vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>::
  _M_move_assign();
  std::
  vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
  ::_M_move_assign(&this->instruments_,&origin->instruments_);
  std::
  vector<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>::
  _M_move_assign(&this->samples_,&origin->samples_);
  std::__cxx11::string::operator=((string *)&this->sound_engine_,(string *)&origin->sound_engine_);
  std::__cxx11::string::operator=((string *)&this->bank_name_,(string *)&origin->bank_name_);
  std::__cxx11::string::operator=((string *)&this->rom_name_,(string *)&origin->rom_name_);
  this->rom_version_ = origin->rom_version_;
  this->has_rom_version_ = origin->has_rom_version_;
  std::__cxx11::string::operator=((string *)&this->creation_date_,(string *)&origin->creation_date_)
  ;
  std::__cxx11::string::operator=((string *)&this->engineers_,(string *)&origin->engineers_);
  std::__cxx11::string::operator=((string *)&this->product_,(string *)&origin->product_);
  std::__cxx11::string::operator=((string *)&this->copyright_,(string *)&origin->copyright_);
  std::__cxx11::string::operator=((string *)&this->comment_,(string *)&origin->comment_);
  std::__cxx11::string::operator=((string *)&this->software_,(string *)&origin->software_);
  SetBackwardReferences(this);
  return this;
}

Assistant:

SoundFont & SoundFont::operator=(SoundFont && origin) noexcept {
  // Copy fields.
  presets_ = std::move(origin.presets_);
  instruments_ = std::move(origin.instruments_);
  samples_ = std::move(origin.samples_);
  sound_engine_ = std::move(origin.sound_engine_);
  bank_name_ = std::move(origin.bank_name_);
  rom_name_ = std::move(origin.rom_name_);
  rom_version_ = std::move(origin.rom_version_);
  has_rom_version_ = std::move(origin.has_rom_version_);
  creation_date_ = std::move(origin.creation_date_);
  engineers_ = std::move(origin.engineers_);
  product_ = std::move(origin.product_);
  copyright_ = std::move(origin.copyright_);
  comment_ = std::move(origin.comment_);
  software_ = std::move(origin.software_);

  // Repair references.
  SetBackwardReferences();

  return *this;
}